

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O1

QString * QSqlQueryModelSql::orderBy(QString *__return_storage_ptr__,QString *s)

{
  long lVar1;
  Data *pDVar2;
  QString *pQVar3;
  long *plVar4;
  qsizetype *pqVar5;
  QArrayData *unaff_R14;
  char16_t **ppcVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QLatin1String QVar8;
  long local_60;
  char16_t *local_58;
  QArrayData *local_50;
  char16_t *local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (s->d).size;
  if (lVar1 == 0) {
    pDVar2 = (s->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (s->d).ptr;
    (__return_storage_ptr__->d).size = 0;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    pqVar5 = &(s->d).size;
    QVar7.m_data = (storage_type *)0x8;
    QVar7.m_size = (qsizetype)&local_50;
    QString::fromLatin1(QVar7);
    unaff_R14 = local_50;
    local_58 = local_48;
    local_60 = local_40;
    if (local_40 == 0) {
      local_50 = &((s->d).d)->super_QArrayData;
      ppcVar6 = &(s->d).ptr;
    }
    else {
      if (*pqVar5 != 0) {
        if (local_50 != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&local_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&local_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QVar8.m_data = (char *)0x1;
        QVar8.m_size = (qsizetype)&local_50;
        pQVar3 = (QString *)QString::append(QVar8);
        plVar4 = (long *)QString::append(pQVar3);
        pDVar2 = (Data *)*plVar4;
        (__return_storage_ptr__->d).d = pDVar2;
        (__return_storage_ptr__->d).ptr = (char16_t *)plVar4[1];
        (__return_storage_ptr__->d).size = plVar4[2];
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (local_50 != (QArrayData *)0x0) {
          LOCK();
          (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50,2,0x10);
          }
        }
        goto LAB_00136000;
      }
      pqVar5 = &local_60;
      ppcVar6 = &local_58;
    }
    (__return_storage_ptr__->d).d = (Data *)local_50;
    (__return_storage_ptr__->d).ptr = *ppcVar6;
    (__return_storage_ptr__->d).size = *pqVar5;
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
LAB_00136000:
  if ((lVar1 != 0) && (unaff_R14 != (QArrayData *)0x0)) {
    LOCK();
    (unaff_R14->ref_)._q_value.super___atomic_base<int>._M_i =
         (unaff_R14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((unaff_R14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(unaff_R14,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline const static QString orderBy(const QString &s) { return s.isEmpty() ? s : concat(orderBy(), s); }